

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

EnumVal * __thiscall flatbuffers::EnumDef::FindByValue(EnumDef *this,string *constant)

{
  bool bVar1;
  char *pcVar2;
  uint64_t local_38;
  uint64_t u64;
  uint64_t uStack_28;
  bool done;
  int64_t i64;
  string *constant_local;
  EnumDef *this_local;
  
  u64._7_1_ = 0;
  i64 = (int64_t)constant;
  constant_local = (string *)this;
  bVar1 = IsUInt64(this);
  if (bVar1) {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    u64._7_1_ = StringToNumber<unsigned_long>(pcVar2,&local_38);
    uStack_28 = local_38;
  }
  else {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    u64._7_1_ = StringToNumber<long>(pcVar2,(int64_t *)&stack0xffffffffffffffd8);
  }
  if ((bool)u64._7_1_ != false) {
    if ((bool)u64._7_1_ == false) {
      this_local = (EnumDef *)0x0;
    }
    else {
      this_local = (EnumDef *)ReverseLookup(this,uStack_28,false);
    }
    return (EnumVal *)this_local;
  }
  __assert_fail("done",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_parser.cpp"
                ,0x916,"EnumVal *flatbuffers::EnumDef::FindByValue(const std::string &) const");
}

Assistant:

EnumVal *EnumDef::FindByValue(const std::string &constant) const {
  int64_t i64;
  auto done = false;
  if (IsUInt64()) {
    uint64_t u64;  // avoid reinterpret_cast of pointers
    done = StringToNumber(constant.c_str(), &u64);
    i64 = static_cast<int64_t>(u64);
  } else {
    done = StringToNumber(constant.c_str(), &i64);
  }
  FLATBUFFERS_ASSERT(done);
  if (!done) return nullptr;
  return ReverseLookup(i64, false);
}